

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

void __thiscall chrono::ChSolverSparseLU::PrintErrorMessage(ChSolverSparseLU *this)

{
  ComputationInfo CVar1;
  ChLog *this_00;
  char *str;
  
  CVar1 = Eigen::SparseLU<Eigen::SparseMatrix<double,_1,_int>,_Eigen::COLAMDOrdering<int>_>::info
                    (&this->m_engine);
  if (CVar1 == Success) {
    str = "computation was successful\n";
  }
  else if (CVar1 == InvalidInput) {
    str = "inputs are invalid, or the algorithm has been improperly called\n";
  }
  else {
    if (CVar1 != NumericalIssue) {
      return;
    }
    str = "LU factorization reported a problem, zero diagonal for instance\n";
  }
  this_00 = GetLog();
  ChStreamOutAscii::operator<<(&this_00->super_ChStreamOutAscii,str);
  return;
}

Assistant:

void ChSolverSparseLU::PrintErrorMessage() {
    // There are only three possible return codes (see Eigen SparseLU.h)
    switch (m_engine.info()) {
        case Eigen::Success:
            GetLog() << "computation was successful\n";
            break;
        case Eigen::NumericalIssue:
            GetLog() << "LU factorization reported a problem, zero diagonal for instance\n";
            break;
        case Eigen::InvalidInput:
            GetLog() << "inputs are invalid, or the algorithm has been improperly called\n";
            break;
        default:
            break;
    }
}